

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O2

int32_t __thiscall
icu_63::StringTrieBuilder::ListBranchNode::markRightEdgesFirst
          (ListBranchNode *this,int32_t edgeNumber)

{
  Node *pNVar1;
  int iVar2;
  long lVar3;
  
  if ((this->super_BranchNode).super_Node.offset != 0) {
    return edgeNumber;
  }
  (this->super_BranchNode).firstEdgeNumber = edgeNumber;
  lVar3 = (long)this->length + 1;
  iVar2 = 0;
  do {
    pNVar1 = this->equal[lVar3 + -2];
    if (pNVar1 != (Node *)0x0) {
      edgeNumber = (*(pNVar1->super_UObject)._vptr_UObject[4])
                             (pNVar1,(ulong)(uint)(edgeNumber + iVar2));
    }
    lVar3 = lVar3 + -1;
    iVar2 = -1;
  } while (1 < lVar3);
  (this->super_BranchNode).super_Node.offset = edgeNumber;
  return edgeNumber;
}

Assistant:

int32_t
StringTrieBuilder::ListBranchNode::markRightEdgesFirst(int32_t edgeNumber) {
    if(offset==0) {
        firstEdgeNumber=edgeNumber;
        int32_t step=0;
        int32_t i=length;
        do {
            Node *edge=equal[--i];
            if(edge!=NULL) {
                edgeNumber=edge->markRightEdgesFirst(edgeNumber-step);
            }
            // For all but the rightmost edge, decrement the edge number.
            step=1;
        } while(i>0);
        offset=edgeNumber;
    }
    return edgeNumber;
}